

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ArgMaxParameter::ArgMaxParameter(ArgMaxParameter *this,ArgMaxParameter *from)

{
  void *pvVar1;
  undefined3 uVar2;
  int32 iVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ArgMaxParameter_0075ffc0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->top_k_ = from->top_k_;
  uVar2 = *(undefined3 *)&from->field_0x19;
  iVar3 = from->axis_;
  this->out_max_val_ = from->out_max_val_;
  *(undefined3 *)&this->field_0x19 = uVar2;
  this->axis_ = iVar3;
  return;
}

Assistant:

ArgMaxParameter::ArgMaxParameter(const ArgMaxParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&out_max_val_, &from.out_max_val_,
    reinterpret_cast<char*>(&top_k_) -
    reinterpret_cast<char*>(&out_max_val_) + sizeof(top_k_));
  // @@protoc_insertion_point(copy_constructor:caffe.ArgMaxParameter)
}